

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-1.c
# Opt level: O0

int checkerBig(void)

{
  int iVar1;
  char *pcVar2;
  int local_20;
  uint local_1c;
  int n;
  int passed;
  FILE *out;
  
  _n = fopen("out.txt","r");
  local_1c = 1;
  if (_n == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    testN = testN + 1;
    out._4_4_ = -1;
  }
  else {
    pcVar2 = ScanInt((FILE *)_n,&local_20);
    if (pcVar2 == "PASSED") {
      if (local_20 != 0x15) {
        local_1c = 0;
        printf("wrong output -- ");
      }
    }
    else {
      local_1c = 0;
    }
    if (local_1c != 0) {
      iVar1 = HaveGarbageAtTheEnd((FILE *)_n);
      local_1c = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    }
    fclose(_n);
    if (local_1c == 0) {
      printf("FAILED\n");
      testN = testN + 1;
      out._4_4_ = 1;
    }
    else {
      printf("PASSED\n");
      testN = testN + 1;
      out._4_4_ = 0;
    }
  }
  return out._4_4_;
}

Assistant:

static int checkerBig(void)
{
    FILE *const out = fopen("out.txt", "r");
    int passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
        } else if (21 != n) {
            passed = 0;
            printf("wrong output -- ");
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}